

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::prod_test::
iu_peep_set_m_x128<test::prod_test::ProtectedProdClass,_test::prod_test::iu_peep_tag_m_x<test::prod_test::ProtectedProdClass>,_&test::prod_test::ProtectedProdClass::m_x>
::iu_peep_set_m_x128
          (iu_peep_set_m_x128<test::prod_test::ProtectedProdClass,_test::prod_test::iu_peep_tag_m_x<test::prod_test::ProtectedProdClass>,_&test::prod_test::ProtectedProdClass::m_x>
           *this)

{
  iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_x<test::prod_test::ProtectedProdClass>>::
  value = 0;
  return;
}

Assistant:

IUTEST(PeepTest, PeepMacro)
{
    IUTEST_PEEP_GET(s_prod, ProdClass, m_x) = 4;
    IUTEST_EXPECT_EQ(4, s_prod.GetX());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(s_prod, ProdClass, m_x));

    IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_prod2.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x));

    IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_protected.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x));
}